

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

void sseq_compress(mdef_t *m)

{
  void *pvVar1;
  hash_entry_t *g_00;
  hash_entry_t *he;
  gnode_t *gn;
  glist_t g;
  int32 k;
  int32 j;
  int32 p;
  int32 n_sseq;
  s3senid_t **sseq;
  hash_table_t *h;
  mdef_t *m_local;
  
  g._0_4_ = m->n_emit_state << 1;
  h = (hash_table_t *)m;
  sseq = (s3senid_t **)hash_table_new(m->n_phone,0);
  j = 0;
  for (k = 0; k < *(int *)((long)&h->table + 4); k = k + 1) {
    pvVar1 = hash_table_enter_bkey
                       ((hash_table_t *)sseq,(&(h[2].table)->key)[k],(long)(int)g,(void *)(long)j);
    g._4_4_ = (int)pvVar1;
    if (g._4_4_ == j) {
      j = j + 1;
    }
    *(int *)(*(long *)&h[1].nocase + (long)k * 0x20) = g._4_4_;
  }
  _p = (hash_entry_t *)
       __ckd_calloc_2d__((long)j,(long)h->size,2,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                         ,0x277);
  g_00 = (hash_entry_t *)hash_table_tolist((hash_table_t *)sseq,(int32 *)((long)&g + 4));
  he = g_00;
  if (g._4_4_ != j) {
    __assert_fail("j == n_sseq",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x27a,"void sseq_compress(mdef_t *)");
  }
  for (; he != (hash_entry_t *)0x0; he = (hash_entry_t *)he->len) {
    g._4_4_ = (int)*(undefined8 *)(he->key + 0x10);
    memcpy((&_p->key)[g._4_4_],*(void **)he->key,(long)(int)g);
  }
  glist_free((glist_t)g_00);
  ckd_free_2d(h[2].table);
  h[2].table = _p;
  h[2].size = j;
  hash_table_free((hash_table_t *)sseq);
  return;
}

Assistant:

static void
sseq_compress(mdef_t * m)
{
    hash_table_t *h;
    s3senid_t **sseq;
    int32 n_sseq;
    int32 p, j, k;
    glist_t g;
    gnode_t *gn;
    hash_entry_t *he;

    k = m->n_emit_state * sizeof(s3senid_t);

    h = hash_table_new(m->n_phone, HASH_CASE_YES);
    n_sseq = 0;

    /* Identify unique senone-sequence IDs.  BUG: tmat-id not being considered!! */
    for (p = 0; p < m->n_phone; p++) {
        /* Add senone sequence to hash table */
	if ((j = (long)
             hash_table_enter_bkey(h, (char *) (m->sseq[p]), k,
				   (void *)(long)n_sseq)) == n_sseq)
            n_sseq++;

        m->phone[p].ssid = j;
    }

    /* Generate compacted sseq table */
    sseq = (s3senid_t **) ckd_calloc_2d(n_sseq, m->n_emit_state, sizeof(s3senid_t));    /* freed in mdef_free() */

    g = hash_table_tolist(h, &j);
    assert(j == n_sseq);

    for (gn = g; gn; gn = gnode_next(gn)) {
        he = (hash_entry_t *) gnode_ptr(gn);
        j = (int32)(long)hash_entry_val(he);
        memcpy(sseq[j], hash_entry_key(he), k);
    }
    glist_free(g);

    /* Free the old, temporary senone sequence table, replace with compacted one */
    ckd_free_2d((void **) m->sseq);
    m->sseq = sseq;
    m->n_sseq = n_sseq;

    hash_table_free(h);
}